

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::StackNode
          (StackNode *this,StackNode *parent_in,string *name_in,StackKind kind_in)

{
  _Rb_tree_header *p_Var1;
  
  this->parent = parent_in;
  std::__cxx11::string::string((string *)&this->name,(string *)name_in);
  this->kind = kind_in;
  (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->children)._M_t._M_impl.super__Rb_tree_header;
  (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->total_runtime = 0.0;
  this->total_kokkos_runtime = 0.0;
  this->number_of_calls = 0;
  this->total_number_of_kernel_calls = 0;
  (this->start_time).impl.__d.__r = 0;
  return;
}

Assistant:

StackNode(StackNode* parent_in, std::string&& name_in, StackKind kind_in)
      : parent(parent_in),
        name(std::move(name_in)),
        kind(kind_in),
        total_runtime(0.),
        total_kokkos_runtime(0.),
        number_of_calls(0),
        total_number_of_kernel_calls(0) {}